

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CGL::Viewer::key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int in_ECX;
  int in_ESI;
  undefined1 in_R8B;
  
  if (in_ECX == 1) {
    if (in_ESI == 0x100) {
      exit(0);
    }
    if (in_ESI == 0x60) {
      showInfo = (showInfo ^ 0xff) & 1;
    }
  }
  (**(code **)(*renderer + 0x50))(renderer,in_ESI,in_ECX,in_R8B);
  return;
}

Assistant:

void Viewer::key_callback( GLFWwindow* window, 
                           int key, int scancode, int action, int mods ) {

  if (action == GLFW_PRESS) {
    if( key == GLFW_KEY_ESCAPE ) { 
      exit(0);
      // glfwSetWindowShouldClose( window, true ); 
    } else if( key == GLFW_KEY_GRAVE_ACCENT ){
      showInfo = !showInfo;
    } 
  }
  
  renderer->keyboard_event( key, action, mods );
}